

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

size_t __thiscall Memory::HeapInfo::Rescan(HeapInfo *this,RescanFlags flags)

{
  uint uVar1;
  size_t sVar2;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  size_t scannedPageCount;
  RescanFlags flags_local;
  HeapInfo *this_local;
  
  _i_1 = 0;
  for (local_24 = 0; local_24 < 0x30; local_24 = local_24 + 1) {
    uVar1 = HeapBucketGroup<SmallAllocationBlockAttributes>::Rescan
                      (this->heapBuckets + local_24,this->recycler,flags);
    _i_1 = (ulong)uVar1 + _i_1;
  }
  for (local_28 = 0; local_28 < 0x1d; local_28 = local_28 + 1) {
    uVar1 = HeapBucketGroup<MediumAllocationBlockAttributes>::Rescan
                      (this->mediumHeapBuckets + local_28,this->recycler,flags);
    _i_1 = (ulong)uVar1 + _i_1;
  }
  sVar2 = LargeHeapBucket::Rescan(&this->largeObjectBucket,flags);
  return sVar2 + _i_1;
}

Assistant:

size_t
HeapInfo::Rescan(RescanFlags flags)
{
    size_t scannedPageCount = 0;

    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        scannedPageCount += heapBuckets[i].Rescan(recycler, flags);
    }

#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
#if SMALLBLOCK_MEDIUM_ALLOC
        scannedPageCount += mediumHeapBuckets[i].Rescan(recycler, flags);
#else
        scannedPageCount += mediumHeapBuckets[i].Rescan(flags);
#endif
    }
#endif

    scannedPageCount += largeObjectBucket.Rescan(flags);

    return scannedPageCount;
}